

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

Balk * __thiscall
Parser::get_balk_from_file(Balk *__return_storage_ptr__,Parser *this,string *file_name)

{
  char cVar1;
  istream *piVar2;
  double *pdVar3;
  runtime_error *prVar4;
  char type;
  int shift;
  double value;
  double segment_length;
  int balk_size;
  int shift_end;
  string line;
  double J;
  double E;
  stringstream stream;
  ifstream file;
  byte local_40d;
  int local_40c;
  double local_408;
  double local_400;
  int local_3f8;
  int local_3f4;
  undefined1 *local_3f0;
  undefined8 local_3e8;
  undefined1 local_3e0;
  undefined7 uStack_3df;
  double local_3d0;
  double local_3c8;
  double local_3c0 [3];
  string local_3a8 [104];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(string *)file_name,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Cannot open Input file");
    *(undefined ***)prVar4 = &PTR__runtime_error_0010ad80;
    __cxa_throw(prVar4,&ParseError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_3f0 = &local_3e0;
  local_3e8 = 0;
  local_3e0 = 0;
  cVar1 = std::ios::widen((char)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_238,(string *)&local_3f0,cVar1);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)local_3c0,(string *)&local_3f0,_S_out|_S_in);
  std::istream::operator>>((istream *)local_3c0,&local_3f8);
  std::istream::_M_extract<double>(local_3c0);
  piVar2 = std::istream::_M_extract<double>(local_3c0);
  std::istream::_M_extract<double>((double *)piVar2);
  Balk::Balk(__return_storage_ptr__,local_3f8,local_400,local_3c8,local_3d0);
  do {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_3f0,cVar1);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
      std::ifstream::close();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
      std::ios_base::~ios_base(local_340);
      if (local_3f0 != &local_3e0) {
        operator_delete(local_3f0,CONCAT71(uStack_3df,local_3e0) + 1);
      }
      std::ifstream::~ifstream(local_238);
      return __return_storage_ptr__;
    }
    std::ios::clear((int)*(undefined8 *)((long)local_3c0[0] + -0x18) + (int)(istream *)local_3c0);
    std::__cxx11::stringbuf::str(local_3a8);
    piVar2 = std::operator>>((istream *)local_3c0,(char *)&local_40d);
    std::istream::operator>>(piVar2,&local_40c);
    switch(local_40d) {
    case 0x4b:
      std::istream::_M_extract<double>(local_3c0);
      Balk::add_elastic_support(__return_storage_ptr__,local_40c,local_400,local_408);
      break;
    case 0x4c:
    case 0x4e:
    case 0x4f:
switchD_00106759_caseD_4c:
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Unknown term");
      *(undefined ***)prVar4 = &PTR__runtime_error_0010ad80;
      __cxa_throw(prVar4,&ParseError::typeinfo,std::runtime_error::~runtime_error);
    case 0x4d:
      std::istream::_M_extract<double>(local_3c0);
      Balk::add_moment(__return_storage_ptr__,local_40c,local_400,local_408);
      break;
    case 0x50:
      std::istream::_M_extract<double>(local_3c0);
      Balk::add_concentrated_power(__return_storage_ptr__,local_40c,local_400,local_408);
      break;
    case 0x51:
      pdVar3 = (double *)std::istream::operator>>((istream *)local_3c0,&local_3f4);
      std::istream::_M_extract<double>(pdVar3);
      Balk::add_uniform_load(__return_storage_ptr__,local_40c,local_400,local_408);
      if (local_3f4 != local_3f8) {
        Balk::add_uniform_load(__return_storage_ptr__,local_3f4,local_400,-local_408);
      }
      break;
    case 0x52:
      Balk::add_hinge_support(__return_storage_ptr__,local_40c,local_400);
      break;
    default:
      if (local_40d != 0x5a) goto switchD_00106759_caseD_4c;
      Balk::add_hard_pinching(__return_storage_ptr__,local_40c,local_400);
    }
  } while( true );
}

Assistant:

Balk Parser::get_balk_from_file(const std::string &file_name)
{
    std::ifstream file{file_name};
    if (!file) {
        throw ParseError("Cannot open Input file");
    }

    std::string line;
    std::getline(file, line);
    std::stringstream stream(line);

    int balk_size;
    double segment_length;
    double E, J;
    stream >> balk_size;
    stream >> segment_length;
    stream >> E >> J;
    Balk balk(balk_size, segment_length, E, J);

    // Parse conditions
    while (std::getline(file, line))
    {
        stream.clear();
        stream.str(line);

        char type;
        int shift, shift_end;
        double value;

        // Read the type of expression
        stream >> type >> shift;

        switch (type)
        {
        case 'R':
            balk.add_hinge_support(shift, segment_length);
            break;
        case 'K':
            stream >> value;
            balk.add_elastic_support(shift, segment_length, value);
            break;

        case 'Z':
            balk.add_hard_pinching(shift, segment_length);
            break;

        case 'P':
            stream >> value;
            balk.add_concentrated_power(shift, segment_length, value);
            break;

        case 'M':
            stream >> value;
            balk.add_moment(shift, segment_length, value);
            break;

        case 'Q':
            stream >> shift_end >> value;
            balk.add_uniform_load(shift, segment_length, value);
            if (shift_end != balk_size)
            {
                balk.add_uniform_load(shift_end, segment_length, -value);
            }
            break;

        default:
            throw ParseError("Unknown term");
        }
    }
    file.close();
    return balk;
}